

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O0

string __thiscall
mjs::anon_unknown_37::date_helper::to_iso_string
          (date_helper *this,gc_heap_ptr<mjs::global_object> *global,double t)

{
  bool bVar1;
  native_error_exception *this_00;
  global_object *this_01;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  wostream *pwVar3;
  int64_t iVar4;
  gc_heap *h;
  undefined8 extraout_RDX;
  string sVar5;
  wstring local_270 [32];
  wstring_view local_250;
  wchar_t local_240;
  int local_23c;
  _Put_time<wchar_t> local_238;
  wostringstream local_228 [8];
  wostringstream woss;
  undefined1 local_b0 [8];
  tm tm;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_70 [2];
  wstring local_50;
  wstring_view local_30;
  double local_20;
  double t_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  local_20 = t;
  t_local = (double)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)this;
  bVar1 = std::isfinite(t);
  if (!bVar1) {
    tm.tm_zone._7_1_ = 1;
    this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
    this_01 = gc_heap_ptr<mjs::global_object>::operator->
                        ((gc_heap_ptr<mjs::global_object> *)t_local);
    global_object::stack_trace_abi_cxx11_(&local_50,this_01);
    local_30 = (wstring_view)
               std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_50);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (local_70,L"Invalid Date");
    native_error_exception::native_error_exception(this_00,range,&local_30,local_70);
    tm.tm_zone._7_1_ = 0;
    __cxa_throw(this_00,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  tm_from_time((tm *)local_b0,local_20);
  std::__cxx11::wostringstream::wostringstream(local_228);
  local_238 = std::put_time<wchar_t>((tm *)local_b0,L"%Y-%m-%dT%H:%M:%S");
  pbVar2 = std::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_228,local_238
                          );
  pwVar3 = std::operator<<(pbVar2,'.');
  local_23c = (int)std::setw(3);
  pwVar3 = std::operator<<(pwVar3,(_Setw)local_23c);
  local_240 = (wchar_t)std::setfill<wchar_t>(L'0');
  pwVar3 = std::operator<<(pwVar3,local_240);
  iVar4 = ms_from_time(local_20);
  pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,iVar4);
  std::operator<<(pwVar3,'Z');
  h = gc_heap_ptr_untyped::heap((gc_heap_ptr_untyped *)t_local);
  std::__cxx11::wostringstream::str();
  local_250 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_270);
  string::string((string *)this,h,&local_250);
  std::__cxx11::wstring::~wstring(local_270);
  std::__cxx11::wostringstream::~wostringstream(local_228);
  sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

static string to_iso_string(const gc_heap_ptr<global_object>& global, double t) {
        if (!std::isfinite(t)) {
            throw native_error_exception{native_error_type::range, global->stack_trace(), invalid_date_string};
        }
        const auto tm = tm_from_time(t);
        std::wostringstream woss;
        woss << std::put_time(&tm, iso_format) << '.' << std::setw(3) << std::setfill(L'0') << ms_from_time(t) << 'Z';
        return string{global.heap(), woss.str()};
    }